

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::base::WeakPtrFactory<perfetto::TracingServiceImpl::ConsumerEndpointImpl>::WeakPtrFactory
          (WeakPtrFactory<perfetto::TracingServiceImpl::ConsumerEndpointImpl> *this,
          ConsumerEndpointImpl *owner)

{
  ConsumerEndpointImpl **__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  __p = (ConsumerEndpointImpl **)operator_new(8);
  *__p = owner;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<perfetto::TracingServiceImpl::ConsumerEndpointImpl**>(&local_18,__p);
  (this->weak_ptr_).handle_.
  super___shared_ptr<perfetto::TracingServiceImpl::ConsumerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = __p;
  (this->weak_ptr_).handle_.
  super___shared_ptr<perfetto::TracingServiceImpl::ConsumerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = local_18._M_pi;
  if (local_18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_18._M_pi)->_M_use_count = (local_18._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_18._M_pi)->_M_use_count = (local_18._M_pi)->_M_use_count + 1;
    }
  }
  if (local_18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18._M_pi);
  }
  return;
}

Assistant:

explicit WeakPtrFactory(T* owner)
      : weak_ptr_(std::shared_ptr<T*>(new T* {owner})) {
    PERFETTO_DCHECK_THREAD(thread_checker);
  }